

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

charcount_t Js::JSONStringifier::CalculateStringElementLength(JavascriptString *str)

{
  char16 cVar1;
  charcount_t cVar2;
  char16 *pcVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  ulong uVar6;
  
  cVar2 = JavascriptString::GetLength(str);
  uVar6 = (ulong)(cVar2 + 2);
  pcVar3 = JavascriptString::GetString(str);
  pcVar4 = JavascriptString::GetString(str);
  pcVar3 = pcVar3 + cVar2;
  if (pcVar4 < pcVar3) {
    do {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      if ((ulong)(ushort)cVar1 < 0x80) {
        uVar6 = uVar6 + (byte)LazyJSONString::escapeMapCount[(ushort)cVar1];
      }
      else if ((cVar1 & 0xfc00U) == 0xd800) {
        pcVar5 = pcVar4 + 1;
        if ((pcVar3 <= pcVar5) || ((*pcVar5 & 0xfc00U) != 0xdc00)) goto LAB_00b66ebb;
      }
      else if ((cVar1 & 0xfc00U) == 0xdc00) {
LAB_00b66ebb:
        uVar6 = uVar6 + 5;
        pcVar5 = pcVar4;
      }
      pcVar4 = pcVar5 + 1;
    } while (pcVar4 < pcVar3);
    if (uVar6 >> 0x20 != 0) {
      Throw::OutOfMemory();
    }
  }
  return (charcount_t)uVar6;
}

Assistant:

charcount_t
JSONStringifier::CalculateStringElementLength(_In_ JavascriptString* str)
{
    const charcount_t strLength = str->GetLength();

    // To avoid overflow checks, use uint64 for intermediate size calculation. We cannot overflow uint64,
    // as stringification will be at most a 5x expansion of the original string (which has max length INT_MAX - 1)
    //
    // All JSON strings are enclosed in double quotes, so add 2 to the length to account for them
    uint64 escapedStrLength = strLength + 2;
    const char16* bufferStart = str->GetString();
    for (const char16* index = str->GetString(); index < bufferStart + strLength; ++index)
    {
        char16 currentCharacter = *index;

        // Some characters may require an escape sequence. We can use the escapeMapCount table
        // to determine how many extra characters are needed
        if (currentCharacter < _countof(LazyJSONString::escapeMapCount))
        {
            escapedStrLength += LazyJSONString::escapeMapCount[currentCharacter];
        }
        else if (utf8::IsLowSurrogateChar(currentCharacter))
        {
            // Lone trailing-surrogate code units should be escaped.
            // They will always need 5 extra characters for the escape sequence, ie: \udbff
            escapedStrLength += 5;
        }
        else if (utf8::IsHighSurrogateChar(currentCharacter))
        {
            if (index + 1 < bufferStart + strLength && utf8::IsLowSurrogateChar(*(index + 1)))
            {
                // Regular surrogate pairs are handled normally - skip the trailing-surrogate code unit.
                index++;
            }
            else
            {
                // High-surrogate code unit not followed by a trailing-surrogate code unit should be escaped.
                escapedStrLength += 5;
            }
        }
    }
    if (escapedStrLength > UINT32_MAX)
    {
        Js::Throw::OutOfMemory();
    }
    return static_cast<charcount_t>(escapedStrLength);
}